

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::GLSL420Pack::QualifierOrderFunctionOutputTest::testInit
          (QualifierOrderFunctionOutputTest *this)

{
  vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
  *this_00;
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  *pvVar1;
  iterator iVar2;
  pointer pvVar3;
  QUALIFIERS local_14;
  
  this_00 = &this->m_test_cases;
  std::
  vector<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
  ::resize(this_00,6);
  pvVar1 = (this->m_test_cases).
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       (pvVar1->
       super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pvVar1->
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar1,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_HIGHP;
    (pvVar1->
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pvVar1 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       (pvVar1->
       super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pvVar1->
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar1,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_PRECISE;
    (pvVar1->
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pvVar1 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       (pvVar1->
       super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pvVar1->
      super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar1,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_OUT;
    (pvVar1->
    super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[1].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[1].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 1,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_OUT;
    *(QUALIFIERS **)
     ((long)&pvVar3[1].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[1].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[1].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 1,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_PRECISE;
    *(QUALIFIERS **)
     ((long)&pvVar3[1].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[1].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[1].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 1,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_HIGHP;
    *(QUALIFIERS **)
     ((long)&pvVar3[1].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[2].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 2,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_PRECISE;
    *(QUALIFIERS **)
     ((long)&pvVar3[2].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[2].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 2,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_MEDIUMP;
    *(QUALIFIERS **)
     ((long)&pvVar3[2].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[2].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[2].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 2,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_OUT;
    *(QUALIFIERS **)
     ((long)&pvVar3[2].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[3].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 3,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_OUT;
    *(QUALIFIERS **)
     ((long)&pvVar3[3].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[3].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 3,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_PRECISE;
    *(QUALIFIERS **)
     ((long)&pvVar3[3].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[3].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[3].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 3,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_MEDIUMP;
    *(QUALIFIERS **)
     ((long)&pvVar3[3].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[4].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[4].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 4,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_LOWP;
    *(QUALIFIERS **)
     ((long)&pvVar3[4].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[4].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[4].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 4,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_OUT;
    *(QUALIFIERS **)
     ((long)&pvVar3[4].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[4].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[4].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 4,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_PRECISE;
    *(QUALIFIERS **)
     ((long)&pvVar3[4].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[5].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[5].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 5,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_OUT;
    *(QUALIFIERS **)
     ((long)&pvVar3[5].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[5].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[5].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 5,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_PRECISE;
    *(QUALIFIERS **)
     ((long)&pvVar3[5].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  pvVar3 = (this_00->
           super__Vector_base<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>,_std::allocator<std::vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar2._M_current =
       *(pointer *)
        ((long)&pvVar3[5].
                super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                ._M_impl.super__Vector_impl_data + 8);
  if (iVar2._M_current ==
      *(pointer *)
       ((long)&pvVar3[5].
               super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
               ._M_impl.super__Vector_impl_data + 0x10)) {
    std::
    vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
    ::_M_realloc_insert<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(pvVar3 + 5,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = QUAL_LOWP;
    *(QUALIFIERS **)
     ((long)&pvVar3[5].
             super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
             ._M_impl.super__Vector_impl_data + 8) = iVar2._M_current + 1;
  }
  return true;
}

Assistant:

bool QualifierOrderFunctionOutputTest::testInit()
{
	m_test_cases.resize(6);

	m_test_cases[0].push_back(Utils::QUAL_HIGHP);
	m_test_cases[0].push_back(Utils::QUAL_PRECISE);
	m_test_cases[0].push_back(Utils::QUAL_OUT);

	m_test_cases[1].push_back(Utils::QUAL_OUT);
	m_test_cases[1].push_back(Utils::QUAL_PRECISE);
	m_test_cases[1].push_back(Utils::QUAL_HIGHP);

	m_test_cases[2].push_back(Utils::QUAL_PRECISE);
	m_test_cases[2].push_back(Utils::QUAL_MEDIUMP);
	m_test_cases[2].push_back(Utils::QUAL_OUT);

	m_test_cases[3].push_back(Utils::QUAL_OUT);
	m_test_cases[3].push_back(Utils::QUAL_PRECISE);
	m_test_cases[3].push_back(Utils::QUAL_MEDIUMP);

	m_test_cases[4].push_back(Utils::QUAL_LOWP);
	m_test_cases[4].push_back(Utils::QUAL_OUT);
	m_test_cases[4].push_back(Utils::QUAL_PRECISE);

	m_test_cases[5].push_back(Utils::QUAL_OUT);
	m_test_cases[5].push_back(Utils::QUAL_PRECISE);
	m_test_cases[5].push_back(Utils::QUAL_LOWP);

	return true;
}